

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Export.cpp
# Opt level: O2

int Assimp_Export(char **params,uint num)

{
  char cVar1;
  char *pcVar2;
  _Alloc_hider _Var3;
  size_type sVar4;
  bool bVar5;
  int iVar6;
  long lVar7;
  size_t index;
  aiExportFormatDesc *paVar8;
  aiScene *pOut;
  ulong uVar9;
  size_type sVar10;
  allocator local_101;
  string out;
  string outf;
  ImportData import;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string outext;
  string in;
  
  if (num == 0) {
    puts("assimp export: Invalid number of arguments. See \'assimp export --help\'");
    return 1;
  }
  pcVar2 = *params;
  cVar1 = *pcVar2;
  if (((((cVar1 == '-') && (pcVar2[1] == 'h')) && (pcVar2[2] == '\0')) ||
      (iVar6 = strcmp(pcVar2,"--help"), iVar6 == 0)) ||
     (((cVar1 == '-' && (pcVar2[1] == '?')) && (pcVar2[2] == '\0')))) {
    printf("%s",AICMD_MSG_EXPORT_HELP_E);
    return 0;
  }
  std::__cxx11::string::string((string *)&in,pcVar2,(allocator *)&import);
  if (num == 1) {
    std::__cxx11::string::string((string *)&out,"-",(allocator *)&import);
  }
  else {
    std::__cxx11::string::string((string *)&out,params[1],(allocator *)&import);
  }
  outext._M_dataplus._M_p = (pointer)&outext.field_2;
  outext._M_string_length = 0;
  outext.field_2._M_local_buf[0] = '\0';
  lVar7 = std::__cxx11::string::rfind('\0',0x2e);
  if (lVar7 != -1) {
    std::__cxx11::string::substr((ulong)&import,(ulong)&out);
    std::__cxx11::string::operator=((string *)&outext,(string *)&import);
    std::__cxx11::string::~string((string *)&import);
    std::__cxx11::string::substr((ulong)&import,(ulong)&out);
    std::__cxx11::string::operator=((string *)&out,(string *)&import);
    std::__cxx11::string::~string((string *)&import);
  }
  import.ppFlags = 0;
  import.showLog = false;
  import.logFile._M_dataplus._M_p = (pointer)&import.logFile.field_2;
  import.logFile._M_string_length = 0;
  import.logFile.field_2._M_local_buf[0] = '\0';
  import.verbose = false;
  import.log = false;
  ProcessStandardArguments(&import,params + 1,num - 1);
  std::__cxx11::string::string((string *)&outf,"",(allocator *)&local_90);
  uVar9 = (ulong)(*out._M_dataplus._M_p != '-');
LAB_00307ee4:
  do {
    sVar4 = outf._M_string_length;
    _Var3._M_p = outf._M_dataplus._M_p;
    uVar9 = uVar9 + 1;
    if (num <= uVar9) break;
    pcVar2 = params[uVar9];
    if (pcVar2 != (char *)0x0) {
      if ((*pcVar2 == '-') && (pcVar2[1] == 'f')) {
        if ((pcVar2[1] == 'f') && (pcVar2[2] == 'i')) goto LAB_00307ee4;
        std::__cxx11::string::string((string *)&local_90,pcVar2 + 2,&local_101);
      }
      else {
        iVar6 = strncmp(pcVar2,"--format=",9);
        if (iVar6 != 0) goto LAB_00307ee4;
        std::__cxx11::string::string((string *)&local_90,pcVar2 + 9,&local_101);
      }
      std::__cxx11::string::operator=((string *)&outf,(string *)&local_90);
      std::__cxx11::string::~string((string *)&local_90);
    }
  } while( true );
  for (sVar10 = 0; sVar4 != sVar10; sVar10 = sVar10 + 1) {
    iVar6 = tolower((int)_Var3._M_p[sVar10]);
    _Var3._M_p[sVar10] = (char)iVar6;
  }
  index = GetMatchingFormat(&outf,false);
  if (index == 0xffffffffffffffff) {
    if (outf._M_string_length != 0) {
      printf("assimp export: warning, format id \'%s\' is unknown\n",outf._M_dataplus._M_p);
    }
    index = GetMatchingFormat(&outf,true);
    if (index == 0xffffffffffffffff) {
      index = GetMatchingFormat(&outext,true);
      if (index == 0xffffffffffffffff) {
        puts("assimp export: no output format specified and I failed to guess it");
        iVar6 = -0x17;
        goto LAB_00308115;
      }
    }
    else {
      std::__cxx11::string::_M_assign((string *)&outext);
    }
  }
  if (*out._M_dataplus._M_p == '-') {
    std::__cxx11::string::rfind((char)&in,0x2e);
    std::__cxx11::string::substr((ulong)&local_90,(ulong)&in);
    std::__cxx11::string::operator=((string *)&out,(string *)&local_90);
    std::__cxx11::string::~string((string *)&local_90);
  }
  paVar8 = Assimp::Exporter::GetExportFormatDescription(globalExporter,index);
  printf("assimp export: select file format: \'%s\' (%s)\n",paVar8->id,paVar8->description);
  pOut = ImportModel(&import,&in);
  if (pOut == (aiScene *)0x0) {
    iVar6 = -0x27;
  }
  else {
    std::operator+(&local_90,".",&outext);
    std::__cxx11::string::append((string *)&out);
    std::__cxx11::string::~string((string *)&local_90);
    bVar5 = ExportModel(pOut,&import,&out,paVar8->id);
    if (bVar5) {
      iVar6 = 0;
      printf("assimp export: wrote output file: %s\n",out._M_dataplus._M_p);
    }
    else {
      iVar6 = -0x19;
    }
  }
LAB_00308115:
  std::__cxx11::string::~string((string *)&outf);
  std::__cxx11::string::~string((string *)&import.logFile);
  std::__cxx11::string::~string((string *)&outext);
  std::__cxx11::string::~string((string *)&out);
  std::__cxx11::string::~string((string *)&in);
  return iVar6;
}

Assistant:

int Assimp_Export(const char* const* params, unsigned int num)
{
	const char* const invalid = "assimp export: Invalid number of arguments. See \'assimp export --help\'\n";
	if (num < 1) {
		printf(invalid);
		return 1;
	}

	// --help
	if (!strcmp( params[0], "-h") || !strcmp( params[0], "--help") || !strcmp( params[0], "-?") ) {
		printf("%s",AICMD_MSG_EXPORT_HELP_E);
		return 0;
	}

	std::string in  = std::string(params[0]);
	std::string out = (num > 1 ? std::string(params[1]) : "-"), outext;

	// 
	const std::string::size_type s = out.find_last_of('.');
	if (s != std::string::npos) {
		outext = out.substr(s+1);
		out = out.substr(0,s);
	}

	// get import flags
	ImportData import;
	ProcessStandardArguments(import,params+1,num-1);

	// process other flags
	std::string outf = "";
	for (unsigned int i = (out[0] == '-' ? 1 : 2); i < num;++i)		{
		if (!params[i]) {
			continue;
		}
		if (!strncmp( params[i], "-f",2)) {
            if ( strncmp( params[ i ], "-fi",3 ))
			    outf = std::string(params[i]+2);
		}
		else if ( !strncmp( params[i], "--format=",9)) {
			outf = std::string(params[i]+9);
		}
	}

	std::transform(outf.begin(),outf.end(),outf.begin(),::tolower);

	// convert the output format to a format id
	size_t outfi = GetMatchingFormat(outf);
	if (outfi == SIZE_MAX) {
		if (outf.length()) {
			printf("assimp export: warning, format id \'%s\' is unknown\n",outf.c_str());
		}

		// retry to see if we know it as file extension
		outfi = GetMatchingFormat(outf,true);
		if (outfi == SIZE_MAX) {
			// retry to see if we know the file extension of the output file
			outfi = GetMatchingFormat(outext,true);

			if (outfi == SIZE_MAX) {
				// still no match -> failure
				printf("assimp export: no output format specified and I failed to guess it\n");
				return -23;
			}
		}
		else {
			outext = outf;
		}
	}
	
	// if no output file is specified, take the file name from input file
	if (out[0] == '-') {
		std::string::size_type s = in.find_last_of('.');
		if (s == std::string::npos) {
			s = in.length();
		}

		out = in.substr(0,s);
	}

	const aiExportFormatDesc* const e =  globalExporter->GetExportFormatDescription(outfi);
	printf("assimp export: select file format: \'%s\' (%s)\n",e->id,e->description);
	
	// import the  model
	const aiScene* scene = ImportModel(import,in);
	if (!scene) {
		return -39;
	}

	// derive the final file name
	out += "."+outext;

	// and call the export routine
	if(!ExportModel(scene, import, out,e->id)) {
		return -25;
	}
	printf("assimp export: wrote output file: %s\n",out.c_str());
	return 0;
}